

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

Float pbrt::AngleBetween<float>(Vector3<float> *v1,Vector3<float> *v2)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  
  uVar2._0_4_ = (v1->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2._4_4_ = (v1->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  uVar3._0_4_ = (v2->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar3._4_4_ = (v2->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  fVar6 = (v2->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar9._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar3;
  auVar9._4_4_ = (float)uVar2._4_4_ * (float)uVar3._4_4_;
  auVar9._8_8_ = 0;
  auVar9 = vmovshdup_avx(auVar9);
  fVar1 = (v1->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar9 = vfmadd231ss_fma(auVar9,auVar7,auVar12);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),ZEXT416((uint)fVar6));
  if (auVar9._0_4_ < 0.0) {
    auVar8._0_4_ = ((float)(undefined4)uVar2 + (float)(undefined4)uVar3) *
                   ((float)(undefined4)uVar2 + (float)(undefined4)uVar3);
    auVar8._4_4_ = ((float)uVar2._4_4_ + (float)uVar3._4_4_) *
                   ((float)uVar2._4_4_ + (float)uVar3._4_4_);
    auVar8._8_8_ = 0;
    auVar9 = vhaddps_avx(auVar8,auVar8);
    auVar9 = ZEXT416((uint)(auVar9._0_4_ + (fVar1 + fVar6) * (fVar1 + fVar6)));
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    auVar7 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
    auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
    uVar4 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar11._0_4_ = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar9._0_4_));
    auVar11._4_60_ = extraout_var;
    auVar9 = vfmadd213ss_fma(auVar11._0_16_,SUB6416(ZEXT464(0xc0000000),0),ZEXT416(0x40490fdb));
    return auVar9._0_4_;
  }
  auVar9 = vsubps_avx(auVar12,auVar7);
  auVar10._0_4_ = auVar9._0_4_ * auVar9._0_4_;
  auVar10._4_4_ = auVar9._4_4_ * auVar9._4_4_;
  auVar10._8_4_ = auVar9._8_4_ * auVar9._8_4_;
  auVar10._12_4_ = auVar9._12_4_ * auVar9._12_4_;
  auVar9 = vhaddps_avx(auVar10,auVar10);
  auVar9 = ZEXT416((uint)(auVar9._0_4_ + (fVar6 - fVar1) * (fVar6 - fVar1)));
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  auVar7 = ZEXT416((uint)(auVar9._0_4_ * 0.5));
  auVar9 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
  uVar4 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar6 = asinf((float)((uint)bVar5 * -0x40800000 + (uint)!bVar5 * auVar9._0_4_));
  return fVar6 + fVar6;
}

Assistant:

PBRT_CPU_GPU inline Float AngleBetween(const Vector3<T> &v1, const Vector3<T> &v2) {
    if (Dot(v1, v2) < 0)
        return Pi - 2 * SafeASin(Length(v1 + v2) / 2);
    else
        return 2 * SafeASin(Length(v2 - v1) / 2);
}